

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,cmLocalGenerator *lg)

{
  bool bVar1;
  iterator iVar2;
  string *this_00;
  cmGeneratorTarget *tgt;
  string namespacedTarget;
  TargetOrString resolved;
  cmGeneratorTarget *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  TargetOrString local_50;
  
  cmGeneratorTarget::ResolveTargetReference(&local_50,target,input,lg);
  local_98 = local_50.Target;
  if (local_50.Target != (cmGeneratorTarget *)0x0) {
    bVar1 = cmGeneratorTarget::IsImported(local_50.Target);
    if (!bVar1) {
      iVar2 = std::
              _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
              ::find(&(this->ExportedTargets)._M_t,&local_98);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        (*this->_vptr_cmExportFileGenerator[0xe])(this,&local_90,target,local_98);
        if (local_90._M_string_length == 0) {
          cmGeneratorTarget::GetName_abi_cxx11_(local_98);
        }
        std::__cxx11::string::_M_assign((string *)input);
        this_00 = &local_90;
      }
      else {
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_70,local_98);
        std::operator+(&local_90,&this->Namespace,&local_70);
        std::__cxx11::string::operator=((string *)input,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_70;
      }
      std::__cxx11::string::~string((string *)this_00);
      goto LAB_002950a7;
    }
    cmGeneratorTarget::GetName_abi_cxx11_(local_50.Target);
  }
  std::__cxx11::string::_M_assign((string *)input);
LAB_002950a7:
  std::__cxx11::string::~string((string *)&local_50);
  return local_50.Target != (cmGeneratorTarget *)0x0;
}

Assistant:

bool cmExportFileGenerator::AddTargetNamespace(std::string& input,
                                               cmGeneratorTarget const* target,
                                               cmLocalGenerator const* lg)
{
  cmGeneratorTarget::TargetOrString resolved =
    target->ResolveTargetReference(input, lg);

  cmGeneratorTarget* tgt = resolved.Target;
  if (!tgt) {
    input = resolved.String;
    return false;
  }

  if (tgt->IsImported()) {
    input = tgt->GetName();
    return true;
  }
  if (this->ExportedTargets.find(tgt) != this->ExportedTargets.end()) {
    input = this->Namespace + tgt->GetExportName();
  } else {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, target, tgt);
    if (!namespacedTarget.empty()) {
      input = namespacedTarget;
    } else {
      input = tgt->GetName();
    }
  }
  return true;
}